

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O0

sysbvm_chunkedAllocatorChunk_t *
sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity
          (sysbvm_chunkedAllocator_t *allocator,size_t size,size_t alignment)

{
  long lVar1;
  _Bool _Var2;
  size_t sVar3;
  void *pvVar4;
  bool bVar5;
  void *handle;
  sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping;
  sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping;
  size_t requiredAlignedSize;
  sysbvm_chunkedAllocatorChunk_t **currentChunk;
  size_t alignment_local;
  size_t size_local;
  sysbvm_chunkedAllocator_t *allocator_local;
  
  requiredAlignedSize = (size_t)&allocator->currentChunk;
  currentChunk = (sysbvm_chunkedAllocatorChunk_t **)alignment;
  alignment_local = size;
  size_local = (size_t)allocator;
  newChunkWriteableMapping =
       (sysbvm_chunkedAllocatorChunk_t *)sysbvm_chunkedAllocator_sizeAlignedTo(size,alignment);
  while( true ) {
    bVar5 = false;
    if (*(long *)requiredAlignedSize != 0) {
      lVar1 = *(long *)(*(long *)requiredAlignedSize + 0x30);
      sVar3 = sysbvm_chunkedAllocator_sizeAlignedTo
                        (*(size_t *)(*(long *)requiredAlignedSize + 0x38),(size_t)currentChunk);
      bVar5 = (sysbvm_chunkedAllocatorChunk_t *)(lVar1 - sVar3) < newChunkWriteableMapping;
    }
    if (!bVar5) break;
    *(undefined8 *)requiredAlignedSize = *(undefined8 *)(*(long *)requiredAlignedSize + 8);
  }
  if (*(long *)requiredAlignedSize == 0) {
    newChunkExecutableMapping = (sysbvm_chunkedAllocatorChunk_t *)0x0;
    handle = (void *)0x0;
    if ((*(byte *)(size_local + 0x20) & 1) == 0) {
      newChunkExecutableMapping =
           (sysbvm_chunkedAllocatorChunk_t *)
           sysbvm_virtualMemory_allocateSystemMemory(*(size_t *)(size_local + 0x18));
      memset(newChunkExecutableMapping,0,0x40);
    }
    else {
      _Var2 = sysbvm_virtualMemory_hasSupportForRWXMapping();
      if (_Var2) {
        handle = sysbvm_virtualMemory_allocateSystemMemory(*(size_t *)(size_local + 0x18));
        newChunkExecutableMapping = (sysbvm_chunkedAllocatorChunk_t *)handle;
        memset(handle,0,0x40);
      }
      else {
        pvVar4 = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping
                           (*(size_t *)(size_local + 0x18),&newChunkExecutableMapping,&handle);
        memset(newChunkExecutableMapping,0,0x40);
        newChunkExecutableMapping->dualMappingHandle = pvVar4;
      }
    }
    newChunkExecutableMapping->capacity = *(long *)(size_local + 0x18) - 0x40;
    newChunkExecutableMapping->writeableMapping = newChunkExecutableMapping;
    newChunkExecutableMapping->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)handle;
    if (*(long *)size_local == 0) {
      *(sysbvm_chunkedAllocatorChunk_t **)size_local = newChunkExecutableMapping;
    }
    if (*(long *)(size_local + 8) != 0) {
      if (((*(byte *)(size_local + 0x20) & 1) != 0) &&
         (_Var2 = sysbvm_virtualMemory_lockCodePagesForWriting
                            (*(void **)(*(long *)(size_local + 8) + 0x10),
                             *(void **)(*(long *)(size_local + 8) + 0x18),0x40), !_Var2)) {
        abort();
      }
      *(sysbvm_chunkedAllocatorChunk_t **)(*(long *)(size_local + 8) + 8) =
           newChunkExecutableMapping;
      newChunkExecutableMapping->previous = *(sysbvm_chunkedAllocatorChunk_s **)(size_local + 8);
      if ((*(byte *)(size_local + 0x20) & 1) != 0) {
        sysbvm_virtualMemory_unlockCodePagesForExecution
                  (*(void **)(*(long *)(size_local + 8) + 0x10),
                   *(void **)(*(long *)(size_local + 8) + 0x18),0x40);
      }
    }
    *(sysbvm_chunkedAllocatorChunk_t **)(size_local + 8) = newChunkExecutableMapping;
    *(sysbvm_chunkedAllocatorChunk_t **)requiredAlignedSize = newChunkExecutableMapping;
  }
  return *(sysbvm_chunkedAllocatorChunk_t **)requiredAlignedSize;
}

Assistant:

static sysbvm_chunkedAllocatorChunk_t *sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(sysbvm_chunkedAllocator_t *allocator, size_t size, size_t alignment)
{
    sysbvm_chunkedAllocatorChunk_t **currentChunk = &allocator->currentChunk;

    // Advance the current chunk.
    size_t requiredAlignedSize = sysbvm_chunkedAllocator_sizeAlignedTo(size, alignment);
    while(*currentChunk && ((*currentChunk)->capacity - sysbvm_chunkedAllocator_sizeAlignedTo((*currentChunk)->size, alignment)) < requiredAlignedSize)
        *currentChunk = (*currentChunk)->next;

    // Create a new chunk if needed
    if(*currentChunk == NULL)
    {
        sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping = NULL;
        sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping = NULL;

        if(allocator->requiresExecutableMapping)
        {
            if(sysbvm_virtualMemory_hasSupportForRWXMapping())
            {
                newChunkExecutableMapping = newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
            }
            else
            {
                void *handle = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping(allocator->chunkSize, (void**)&newChunkWriteableMapping, (void**)&newChunkExecutableMapping);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
                newChunkWriteableMapping->dualMappingHandle = handle;
            }
        }
        else
        {
            newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
            memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        
        newChunkWriteableMapping->capacity = allocator->chunkSize - sizeof(sysbvm_chunkedAllocatorChunk_t);
        newChunkWriteableMapping->writeableMapping = newChunkWriteableMapping;
        newChunkWriteableMapping->executableMapping = newChunkExecutableMapping;

        if(!allocator->firstChunk)
            allocator->firstChunk = newChunkWriteableMapping;

        if(allocator->lastChunk)
        {
            if(allocator->requiresExecutableMapping &&
                !sysbvm_virtualMemory_lockCodePagesForWriting(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t)))
                abort();

            allocator->lastChunk->next = newChunkWriteableMapping;
            newChunkWriteableMapping->previous = allocator->lastChunk;

            if(allocator->requiresExecutableMapping)
                sysbvm_virtualMemory_unlockCodePagesForExecution(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        allocator->lastChunk = newChunkWriteableMapping;

        *currentChunk = newChunkWriteableMapping;
    }

    return *currentChunk;

}